

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# newline_string.c
# Opt level: O0

int mpt_newline_native(void)

{
  return 2;
}

Assistant:

extern int mpt_newline_native(void)
{
#if defined(__APPLE__)
	return MPT_ENUM(NewlineMac);
#elif defined(__unix__) || defined(__unix)
	return MPT_ENUM(NewlineUnix);
#elif defined(_WIN32) || defined(_WIN64)
	return MPT_ENUM(NewlineNet);
#else
# error: no native platform line separator
#endif
}